

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

void __thiscall
pybind11::detail::loader_life_support::~loader_life_support(loader_life_support *this)

{
  pointer pp_Var1;
  PyObject *op;
  internals *piVar2;
  ulong uVar3;
  pointer pp_Var4;
  
  piVar2 = get_internals();
  pp_Var4 = (piVar2->loader_patient_stack).super__Vector_base<_object_*,_std::allocator<_object_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pp_Var1 = (piVar2->loader_patient_stack).super__Vector_base<_object_*,_std::allocator<_object_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pp_Var4 == pp_Var1) {
    pybind11_fail("loader_life_support: internal error");
  }
  op = pp_Var1[-1];
  (piVar2->loader_patient_stack).super__Vector_base<_object_*,_std::allocator<_object_*>_>._M_impl.
  super__Vector_impl_data._M_finish = pp_Var1 + -1;
  if (op != (PyObject *)0x0) {
    _Py_DECREF(op);
    pp_Var4 = (piVar2->loader_patient_stack).
              super__Vector_base<_object_*,_std::allocator<_object_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  uVar3 = (long)(piVar2->loader_patient_stack).
                super__Vector_base<_object_*,_std::allocator<_object_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage - (long)pp_Var4 >> 3;
  if (((0x10 < uVar3) &&
      (pp_Var1 = (piVar2->loader_patient_stack).
                 super__Vector_base<_object_*,_std::allocator<_object_*>_>._M_impl.
                 super__Vector_impl_data._M_finish, pp_Var4 != pp_Var1)) &&
     (2 < uVar3 / (ulong)((long)pp_Var1 - (long)pp_Var4 >> 3))) {
    std::vector<_object_*,_std::allocator<_object_*>_>::_M_shrink_to_fit
              (&piVar2->loader_patient_stack);
    return;
  }
  return;
}

Assistant:

~loader_life_support() {
        auto &stack = get_internals().loader_patient_stack;
        if (stack.empty())
            pybind11_fail("loader_life_support: internal error");

        auto ptr = stack.back();
        stack.pop_back();
        Py_CLEAR(ptr);

        // A heuristic to reduce the stack's capacity (e.g. after long recursive calls)
        if (stack.capacity() > 16 && !stack.empty() && stack.capacity() / stack.size() > 2)
            stack.shrink_to_fit();
    }